

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O2

void __thiscall gv_visitor::visit(gv_visitor *this,IfElseStatement *ptr)

{
  Expr *second;
  Statement *pSVar1;
  string local_48;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"if else statement",&local_21);
  box(this,ptr,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  second = ptr->condition;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"condition",&local_21);
  arrow(this,ptr,second,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (**(ptr->condition->super_Base)._vptr_Base)(ptr->condition,this);
  pSVar1 = ptr->do_if_true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"true",&local_21);
  arrow(this,ptr,pSVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (**(ptr->do_if_true->super_Base)._vptr_Base)(ptr->do_if_true,this);
  pSVar1 = ptr->do_else;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"else",&local_21);
  arrow(this,ptr,pSVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (**(ptr->do_else->super_Base)._vptr_Base)(ptr->do_else,this);
  return;
}

Assistant:

void gv_visitor::visit(IfElseStatement* ptr) {
    box(ptr, "if else statement");
    arrow(ptr, ptr->condition, "condition");
    ptr->condition->accept(this);
    arrow(ptr, ptr->do_if_true, "true");
    ptr->do_if_true->accept(this);
    arrow(ptr, ptr->do_else, "else");
    ptr->do_else->accept(this);
}